

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O2

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,char *binDir)

{
  bool bVar1;
  long lVar2;
  unsigned_long uVar3;
  char *pcVar4;
  string *psVar5;
  ulong dindex;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  Directory dir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  string fullPath;
  string m;
  string bdir;
  allocator local_d9;
  Directory local_d8;
  cmCoreTryCompile *local_d0;
  char *local_c8;
  undefined1 local_c0 [32];
  _Base_ptr local_a0;
  size_t local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50 [32];
  
  if (binDir != (char *)0x0) {
    local_d0 = this;
    std::__cxx11::string::string(local_50,binDir,(allocator *)local_c0);
    lVar2 = std::__cxx11::string::find((char *)local_50,0x52949b);
    if (lVar2 == -1) {
      cmSystemTools::Error
                ("TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                 binDir,(char *)0x0,(char *)0x0);
    }
    else {
      cmsys::Directory::Directory(&local_d8);
      std::__cxx11::string::string((string *)local_c0,binDir,(allocator *)&local_90);
      local_c8 = binDir;
      cmsys::Directory::Load(&local_d8,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
      local_c0._24_8_ = local_c0 + 8;
      local_c0._8_4_ = _S_red;
      local_c0._16_8_ = 0;
      local_98 = 0;
      dindex = 0;
      local_a0 = (_Base_ptr)local_c0._24_8_;
      while( true ) {
        uVar3 = cmsys::Directory::GetNumberOfFiles(&local_d8);
        if (uVar3 <= dindex) break;
        pcVar4 = cmsys::Directory::GetFile(&local_d8,dindex);
        if ((*pcVar4 != '.') || ((pcVar4[1] != '\0' && ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))
           ) {
          std::__cxx11::string::string((string *)&local_90,pcVar4,(allocator *)&local_70);
          pVar6 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_c0,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::string((string *)&local_70,local_c8,&local_d9);
            pcVar4 = (char *)std::__cxx11::string::append((char *)&local_70);
            psVar5 = (string *)std::__cxx11::string::append(pcVar4);
            std::__cxx11::string::string((string *)&local_90,psVar5);
            std::__cxx11::string::~string((string *)&local_70);
            bVar1 = cmsys::SystemTools::FileIsDirectory(&local_90);
            if (bVar1) {
              CleanupFiles(local_d0,local_90._M_dataplus._M_p);
              cmsys::SystemTools::RemoveADirectory(&local_90);
            }
            else {
              bVar1 = cmsys::SystemTools::RemoveFile(&local_90);
              if (!bVar1) {
                std::operator+(&local_70,"Remove failed on file: ",&local_90);
                cmSystemTools::ReportLastSystemError(local_70._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&local_70);
              }
            }
            std::__cxx11::string::~string((string *)&local_90);
          }
        }
        dindex = dindex + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
      cmsys::Directory::~Directory(&local_d8);
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(const char* binDir)
{
  if (!binDir) {
    return;
  }

  std::string bdir = binDir;
  if (bdir.find("CMakeTmp") == std::string::npos) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:",
      binDir);
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath.c_str());
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while (!cmSystemTools::RemoveFile(fullPath.c_str()) &&
                 --retry.Count &&
                 cmSystemTools::FileExists(fullPath.c_str())) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          if (!cmSystemTools::RemoveFile(fullPath))
#endif
          {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
          }
        }
      }
    }
  }
}